

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *c1,Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *c2)

{
  ID_index IVar1;
  ID_index IVar2;
  pointer ppEVar3;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  bool bVar7;
  ulong uVar8;
  pointer ppEVar9;
  allocator_type local_b9;
  value_type local_b8;
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  local_b0;
  Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  local_70;
  
  if (c1 == c2) {
    bVar7 = true;
  }
  else {
    local_70.super_Column_dimension_option.dim_ = (c1->super_Column_dimension_option).dim_;
    local_70.super_Chain_column_option.pivot_ = (c1->super_Chain_column_option).pivot_;
    local_70.super_Chain_column_option.pairedColumn_ = (c1->super_Chain_column_option).pairedColumn_
    ;
    local_b0.super_Column_dimension_option.dim_ = 0;
    local_b0.super_Chain_column_option.pivot_ = 0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::vector(&local_70.column_,
             (long)(c1->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(c1->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_b0,
             (allocator_type *)&local_b8);
    local_70.insertsSinceLastPrune_ = 0;
    local_70.operators_ = c1->operators_;
    local_70.entryPool_ = c1->entryPool_;
    ppEVar9 = (c1->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (c1->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar9 != ppEVar3) {
      uVar8 = 0;
      do {
        IVar1 = (*ppEVar9)->rowIndex_;
        pEVar4 = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(4);
        pEVar4->rowIndex_ = IVar1;
        local_70.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8] = pEVar4;
        ppEVar9 = ppEVar9 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (ppEVar9 != ppEVar3);
    }
    local_b0.super_Column_dimension_option.dim_ = (c2->super_Column_dimension_option).dim_;
    local_b0.super_Chain_column_option.pivot_ = (c2->super_Chain_column_option).pivot_;
    local_b0.super_Chain_column_option.pairedColumn_ = (c2->super_Chain_column_option).pairedColumn_
    ;
    local_b8 = (value_type)0x0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::vector(&local_b0.column_,
             (long)(c2->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(c2->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_b8,&local_b9);
    local_b0.insertsSinceLastPrune_ = 0;
    local_b0.operators_ = c2->operators_;
    local_b0.entryPool_ = c2->entryPool_;
    ppEVar9 = (c2->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (c2->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar9 != ppEVar3) {
      uVar8 = 0;
      do {
        IVar1 = (*ppEVar9)->rowIndex_;
        pEVar4 = (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(4);
        pEVar4->rowIndex_ = IVar1;
        local_b0.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8] = pEVar4;
        ppEVar9 = ppEVar9 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (ppEVar9 != ppEVar3);
    }
    pEVar5 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(&local_70);
    pEVar6 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             ::_pop_pivot(&local_b0);
    while ((pEVar5 != (Entry *)0x0 && (pEVar6 != (Entry *)0x0))) {
      IVar1 = pEVar5->rowIndex_;
      IVar2 = pEVar6->rowIndex_;
      operator_delete(pEVar5,4);
      operator_delete(pEVar6,4);
      if (IVar1 != IVar2) goto LAB_0014d723;
      pEVar5 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               ::_pop_pivot(&local_70);
      pEVar6 = Heap_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
               ::_pop_pivot(&local_b0);
    }
    bVar7 = true;
    ppEVar9 = local_b0.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pEVar5 != (Entry *)0x0 || pEVar6 != (Entry *)0x0) {
      if (pEVar5 != (Entry *)0x0) {
        pEVar6 = pEVar5;
      }
      operator_delete(pEVar6,4);
LAB_0014d723:
      bVar7 = false;
      ppEVar9 = local_b0.column_.
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; ppEVar9 !=
           local_b0.column_.
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppEVar9 = ppEVar9 + 1) {
      operator_delete(*ppEVar9,4);
    }
    ppEVar9 = local_70.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_b0.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      ppEVar9 = local_70.column_.
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; ppEVar9 !=
           local_70.column_.
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppEVar9 = ppEVar9 + 1) {
      operator_delete(*ppEVar9,4);
    }
    if (local_70.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar7;
}

Assistant:

bool operator==(const Heap_column& c1, const Heap_column& c2) {
    if (&c1 == &c2) return true;

    Heap_column cc1(c1), cc2(c2);
    Entry* p1 = cc1._pop_pivot();
    Entry* p2 = cc2._pop_pivot();
    while (p1 != nullptr && p2 != nullptr) {
      if (p1->get_row_index() != p2->get_row_index()) {
        c1.entryPool_->destroy(p1);
        c2.entryPool_->destroy(p2);
        return false;
      }
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if (p1->get_element() != p2->get_element()) {
          c1.entryPool_->destroy(p1);
          c2.entryPool_->destroy(p2);
          return false;
        }
      }
      c1.entryPool_->destroy(p1);
      c2.entryPool_->destroy(p2);
      p1 = cc1._pop_pivot();
      p2 = cc2._pop_pivot();
    }

    if (p1 == nullptr && p2 == nullptr) return true;
    if (p1 != nullptr) {
      c1.entryPool_->destroy(p1);
      return false;
    }
    c2.entryPool_->destroy(p2);
    return false;
  }